

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int CostManagerInit(CostManager *manager,uint16_t *dist_array,int pix_count,CostModel *cost_model)

{
  int64_t iVar1;
  void *pvVar2;
  uint32_t in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int64_t cost_val;
  CostCacheInterval *cur;
  int cost_cache_size;
  int i;
  uint32_t uVar3;
  uint32_t length;
  CostManager *in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  long *nmemb;
  long *plVar4;
  int local_2c;
  int local_4;
  
  uVar3 = in_EDX;
  if (0xfff < (int)in_EDX) {
    uVar3 = 0xfff;
  }
  in_RDI[0x1003] = 0;
  in_RDI[2] = 0;
  *in_RDI = 0;
  in_RDI[0x1038] = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  in_RDI[0x1004] = in_RSI;
  length = uVar3;
  CostManagerInitFreeList(in_stack_ffffffffffffffc0);
  for (local_2c = 0; local_2c < (int)uVar3; local_2c = local_2c + 1) {
    iVar1 = GetLengthCost((CostModel *)in_stack_ffffffffffffffc0,length);
    in_RDI[(long)local_2c + 4] = iVar1;
  }
  in_RDI[3] = 1;
  for (local_2c = 1; local_2c < (int)uVar3; local_2c = local_2c + 1) {
    if (in_RDI[(long)local_2c + 4] != in_RDI[(long)(local_2c + -1) + 4]) {
      in_RDI[3] = in_RDI[3] + 1;
    }
  }
  pvVar2 = WebPSafeMalloc(in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  in_RDI[2] = pvVar2;
  if (in_RDI[2] == 0) {
    CostManagerClear((CostManager *)0x1a14b4);
    local_4 = 0;
  }
  else {
    nmemb = (long *)in_RDI[2];
    *(undefined4 *)(nmemb + 1) = 0;
    *(undefined4 *)((long)nmemb + 0xc) = 1;
    *nmemb = in_RDI[4];
    for (local_2c = 1; local_2c < (int)uVar3; local_2c = local_2c + 1) {
      in_stack_ffffffffffffffc0 = (CostManager *)in_RDI[(long)local_2c + 4];
      plVar4 = nmemb;
      if (in_stack_ffffffffffffffc0 != (CostManager *)*nmemb) {
        plVar4 = nmemb + 2;
        *(int *)(nmemb + 3) = local_2c;
        *plVar4 = (long)in_stack_ffffffffffffffc0;
      }
      *(int *)((long)plVar4 + 0xc) = local_2c + 1;
      nmemb = plVar4;
    }
    pvVar2 = WebPSafeMalloc((uint64_t)nmemb,(size_t)in_stack_ffffffffffffffc0);
    in_RDI[0x1003] = pvVar2;
    if (in_RDI[0x1003] == 0) {
      CostManagerClear((CostManager *)0x1a15a7);
      local_4 = 0;
    }
    else {
      for (local_2c = 0; local_2c < (int)in_EDX; local_2c = local_2c + 1) {
        *(undefined8 *)(in_RDI[0x1003] + (long)local_2c * 8) = 0x7fffffffffffffff;
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int CostManagerInit(CostManager* const manager,
                           uint16_t* const dist_array, int pix_count,
                           const CostModel* const cost_model) {
  int i;
  const int cost_cache_size = (pix_count > MAX_LENGTH) ? MAX_LENGTH : pix_count;

  manager->costs_ = NULL;
  manager->cache_intervals_ = NULL;
  manager->head_ = NULL;
  manager->recycled_intervals_ = NULL;
  manager->count_ = 0;
  manager->dist_array_ = dist_array;
  CostManagerInitFreeList(manager);

  // Fill in the cost_cache_.
  // Has to be done in two passes due to a GCC bug on i686
  // related to https://gcc.gnu.org/bugzilla/show_bug.cgi?id=323
  for (i = 0; i < cost_cache_size; ++i) {
    manager->cost_cache_[i] = GetLengthCost(cost_model, i);
  }
  manager->cache_intervals_size_ = 1;
  for (i = 1; i < cost_cache_size; ++i) {
    // Get the number of bound intervals.
    if (manager->cost_cache_[i] != manager->cost_cache_[i - 1]) {
      ++manager->cache_intervals_size_;
    }
  }

  // With the current cost model, we usually have below 20 intervals.
  // The worst case scenario with a cost model would be if every length has a
  // different cost, hence MAX_LENGTH but that is impossible with the current
  // implementation that spirals around a pixel.
  assert(manager->cache_intervals_size_ <= MAX_LENGTH);
  manager->cache_intervals_ = (CostCacheInterval*)WebPSafeMalloc(
      manager->cache_intervals_size_, sizeof(*manager->cache_intervals_));
  if (manager->cache_intervals_ == NULL) {
    CostManagerClear(manager);
    return 0;
  }

  // Fill in the cache_intervals_.
  {
    CostCacheInterval* cur = manager->cache_intervals_;

    // Consecutive values in cost_cache_ are compared and if a big enough
    // difference is found, a new interval is created and bounded.
    cur->start_ = 0;
    cur->end_ = 1;
    cur->cost_ = manager->cost_cache_[0];
    for (i = 1; i < cost_cache_size; ++i) {
      const int64_t cost_val = manager->cost_cache_[i];
      if (cost_val != cur->cost_) {
        ++cur;
        // Initialize an interval.
        cur->start_ = i;
        cur->cost_ = cost_val;
      }
      cur->end_ = i + 1;
    }
    assert((size_t)(cur - manager->cache_intervals_) + 1 ==
           manager->cache_intervals_size_);
  }

  manager->costs_ =
      (int64_t*)WebPSafeMalloc(pix_count, sizeof(*manager->costs_));
  if (manager->costs_ == NULL) {
    CostManagerClear(manager);
    return 0;
  }
  // Set the initial costs_ to INT64_MAX for every pixel as we will keep the
  // minimum.
  for (i = 0; i < pix_count; ++i) manager->costs_[i] = WEBP_INT64_MAX;

  return 1;
}